

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<26>::ReactionProduct::ReactionProduct
          (ReactionProduct *this,Multiplicity *multiplicity,Distribution *distribution)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_6_ReactionProduct_src_ctor_hpp:12:26),_std::variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>_&>
  distributionLaw;
  anon_class_1_0_00000001 local_21;
  
  uVar2 = *(undefined8 *)
           &(multiplicity->super_TabulationRecord).super_InterpolationBase.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>;
  lVar1 = ((_Head_base<4UL,_long,_false> *)
          ((long)&(multiplicity->super_TabulationRecord).super_InterpolationBase.metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl;
  lVar3 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(multiplicity->super_TabulationRecord).super_InterpolationBase.metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  lVar4 = ((_Head_base<2UL,_long,_false> *)
          ((long)&(multiplicity->super_TabulationRecord).super_InterpolationBase.metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  dVar5 = (multiplicity->super_TabulationRecord).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       (multiplicity->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  (this->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar5;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl = lVar3;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl = lVar4;
  *(undefined8 *)
   &(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> = uVar2;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl = lVar1;
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.boundaryIndices,
             &(multiplicity->super_TabulationRecord).super_InterpolationBase.boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices,
             &(multiplicity->super_TabulationRecord).super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->multiplicity_).super_TabulationRecord.xValues,
             &(multiplicity->super_TabulationRecord).xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->multiplicity_).super_TabulationRecord.yValues,
             &(multiplicity->super_TabulationRecord).yValues);
  std::__detail::__variant::
  _Copy_ctor_base<false,_njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     *)&this->law_,
                    (_Copy_ctor_base<false,_njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     *)distribution);
  lVar1 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(this->multiplicity_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  distributionLaw =
       std::
       visit<njoy::ENDFtk::section::Type<26>::ReactionProduct::ReactionProduct(njoy::ENDFtk::section::Type<26>::Multiplicity&&,std::variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>&&)::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,njoy::ENDFtk::section::Type<26>::EnergyTransfer>&>
                 (&local_21,&this->law_);
  verifyLAW((int)lVar1,distributionLaw);
  return;
}

Assistant:

ReactionProduct( Multiplicity&& multiplicity,
                 Distribution&& distribution ) :
  multiplicity_( multiplicity ), law_( distribution ) {

  verifyLAW( this->multiplicity_.LAW(),
             std::visit( [] ( const auto& v ) -> int { return v.LAW(); },
                         this->law_ ) );
}